

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_is_method_disabled(char *name)

{
  char cVar1;
  char *pcVar2;
  int local_5c;
  char local_58 [4];
  int i;
  char environment [64];
  char *name_local;
  
  evutil_snprintf(local_58,0x40,"EVENT_NO%s",name);
  for (local_5c = 8; local_58[local_5c] != '\0'; local_5c = local_5c + 1) {
    cVar1 = EVUTIL_TOUPPER_(local_58[local_5c]);
    local_58[local_5c] = cVar1;
  }
  pcVar2 = evutil_getenv_(local_58);
  return (int)(pcVar2 != (char *)0x0);
}

Assistant:

static int
event_is_method_disabled(const char *name)
{
	char environment[64];
	int i;

	evutil_snprintf(environment, sizeof(environment), "EVENT_NO%s", name);
	for (i = 8; environment[i] != '\0'; ++i)
		environment[i] = EVUTIL_TOUPPER_(environment[i]);
	/* Note that evutil_getenv_() ignores the environment entirely if
	 * we're setuid */
	return (evutil_getenv_(environment) != NULL);
}